

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-parse.c
# Opt level: O2

int fy_scan_tag_handle(fy_parser *fyp,_Bool is_directive,fy_atom *handle)

{
  int advance;
  int iVar1;
  
  iVar1 = 0;
  advance = fy_scan_tag_handle_length(fyp,0);
  if (advance < 1) {
    fy_parser_diag(fyp,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                   ,0x568,"fy_scan_tag_handle","fy_scan_tag_handle_length() failed");
    iVar1 = -1;
  }
  else {
    fy_fill_atom(fyp,advance,handle);
  }
  return iVar1;
}

Assistant:

int fy_scan_tag_handle(struct fy_parser *fyp, bool is_directive,
                       struct fy_atom *handle) {
    int length;

    length = fy_scan_tag_handle_length(fyp, 0);
    fyp_error_check(fyp, length > 0, err_out,
                    "fy_scan_tag_handle_length() failed");

    fy_fill_atom(fyp, length, handle);

    return 0;

    err_out:
    return -1;
}